

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_find_highest_nonzero_word_pair
               (mp_int *x,size_t shift_wanted,size_t *index,uint64_t *hi,uint64_t *lo)

{
  ulong uVar1;
  size_t curr_index;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  for (curr_index = 0; curr_index < x->nw; curr_index = curr_index + 1) {
    uVar1 = x->w[curr_index];
    uVar3 = uVar1 >> 1;
    if (index != (size_t *)0x0) {
      uVar4 = uVar1;
      if ((uVar1 & 1) == 0 && uVar3 == 0) {
        uVar4 = *index;
      }
      *index = uVar4;
    }
    if (hi != (uint64_t *)0x0) {
      if ((uVar1 & 1) == 0 && uVar3 == 0) {
        uVar2 = *hi;
      }
      *hi = uVar2;
    }
    if (shift_wanted != 0) {
      uVar2 = curr_index;
      if ((uVar1 & 1) == 0 && uVar3 == 0) {
        uVar2 = *(ulong *)shift_wanted;
      }
      *(ulong *)shift_wanted = uVar2;
    }
    uVar2 = uVar1;
  }
  return;
}

Assistant:

static inline void mp_find_highest_nonzero_word_pair(
    mp_int *x, size_t shift_wanted, size_t *index,
    uint64_t *hi, uint64_t *lo)
{
    uint64_t curr_hi = 0, curr_lo = 0;

    for (size_t curr_index = 0; curr_index < x->nw; curr_index++) {
        BignumInt curr_word = x->w[curr_index];
        unsigned indicator = normalise_to_1(curr_word);

        curr_lo = (BIGNUM_INT_BITS < 64 ? (curr_lo >> BIGNUM_INT_BITS) : 0) |
            (curr_hi << (64 - BIGNUM_INT_BITS));
        curr_hi = (BIGNUM_INT_BITS < 64 ? (curr_hi >> BIGNUM_INT_BITS) : 0) |
            ((uint64_t)curr_word << shift_wanted);

        if (hi)    *hi    ^= (curr_hi    ^ *hi   ) & -(uint64_t)indicator;
        if (lo)    *lo    ^= (curr_lo    ^ *lo   ) & -(uint64_t)indicator;
        if (index) *index ^= (curr_index ^ *index) & -(size_t)  indicator;
    }
}